

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::WorkflowPresetsHelper
          (vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::WorkflowPreset> *in_R8;
  Object<cmCMakePresetsGraph::WorkflowPreset> OStack_38;
  
  if (WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::WorkflowPreset>::Object
                (&OStack_38,
                 (Object<cmCMakePresetsGraph::WorkflowPreset> *)
                 (anonymous_namespace)::WorkflowPresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::WorkflowPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>>
                (&WorkflowPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&OStack_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::WorkflowPreset>::Member>_>
      ::~vector(&OStack_38.Members);
      __cxa_atexit(std::_Function_base::~_Function_base,&WorkflowPresetsHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&WorkflowPresetsHelper(std::vector<cmCMakePresetsGraph::WorkflowPreset,std::allocator<cmCMakePresetsGraph::WorkflowPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::WorkflowPreset,_std::allocator<cmCMakePresetsGraph::WorkflowPreset>_>_&,_const_Json::Value_*)>
          ::operator()(&WorkflowPresetsHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult WorkflowPresetsHelper(
  std::vector<cmCMakePresetsGraph::WorkflowPreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<WorkflowPreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      WorkflowPresetHelper);

  return helper(out, value);
}